

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash_dictionary_handler.c
# Opt level: O0

ion_cursor_status_t oadict_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  int iVar1;
  ion_dictionary_parent_t *piVar2;
  ion_dictionary_compare_t p_Var3;
  ion_err_t iVar4;
  int iVar5;
  ion_hash_bucket_t *item;
  int data_length;
  ion_hashmap_t *hash_map;
  ion_oadict_cursor_t *oadict_cursor;
  ion_record_t *record_local;
  ion_dict_cursor_t *cursor_local;
  
  if (cursor->status == '\x03') {
    cursor_local._7_1_ = cursor->status;
  }
  else if (cursor->status == '\x01') {
    cursor_local._7_1_ = cursor->status;
  }
  else if ((cursor->status == '\x02') || (cursor->status == '\x04')) {
    piVar2 = cursor->dictionary->instance;
    iVar5 = (piVar2->record).key_size;
    iVar1 = (piVar2->record).value_size;
    if (cursor->status == '\x04') {
      iVar4 = oadict_scan((ion_oadict_cursor_t *)cursor);
      if (iVar4 == '\x01') {
        cursor->status = '\x01';
        return cursor->status;
      }
    }
    else {
      cursor->status = '\x04';
    }
    p_Var3 = piVar2[1].compare;
    iVar5 = (iVar5 + iVar1 + 1) * *(int *)&cursor[1].field_0x4;
    memcpy(record->key,p_Var3 + (long)iVar5 + 1,(long)(piVar2->record).key_size);
    memcpy(record->value,p_Var3 + (long)(piVar2->record).key_size + (long)iVar5 + 1,
           (long)(piVar2->record).value_size);
    cursor_local._7_1_ = cursor->status;
  }
  else {
    cursor_local._7_1_ = '\0';
  }
  return cursor_local._7_1_;
}

Assistant:

ion_cursor_status_t
oadict_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_oadict_cursor_t *oadict_cursor = (ion_oadict_cursor_t *) cursor;

	/* check the status of the cursor and if it is not valid or at the end, just exit */
	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		/* cursor is active and results have never been accessed */
		/* extract reference to map */
		ion_hashmap_t *hash_map = ((ion_hashmap_t *) cursor->dictionary->instance);

		/* assume that the value has been pre-allocated */
		/* compute length of data record stored in map */
		int data_length = hash_map->super.record.key_size + hash_map->super.record.value_size;

		if (cursor->status == cs_cursor_active) {
			/* find the next valid entry */

			/* scan and determine what to do? */
			if (cs_end_of_results == oadict_scan(oadict_cursor)) {
				/* Then this is the end and there are no more results */
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
		}
		else {
			/* if the cursor is initialized but not active, then just read the data and set cursor active */
			cursor->status = cs_cursor_active;
		}

		/* the results are now ready //reference item at given position */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (data_length + SIZEOF(STATUS)) * oadict_cursor->current /*idx*/))));

		memcpy(record->key, (item->data), hash_map->super.record.key_size);

		memcpy(record->value, (item->data + hash_map->super.record.key_size), hash_map->super.record.value_size);

		/* and update current cursor position */
		return cursor->status;
	}

	/* and if you get this far, the cursor is invalid */
	return cs_invalid_cursor;
}